

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86_64-gen.c
# Opt level: O0

void orex(int ll,int r,int r2,int b)

{
  undefined4 local_14;
  int b_local;
  int r2_local;
  int r_local;
  int ll_local;
  
  b_local = r;
  if (0x2f < (r & 0x3fU)) {
    b_local = 0;
  }
  local_14 = r2;
  if (0x2f < (r2 & 0x3fU)) {
    local_14 = 0;
  }
  if (((ll != 0) || ((b_local >> 3 & 1U) != 0)) || ((local_14 >> 3 & 1U) != 0)) {
    o(b_local >> 3 & 1U | 0x40 | (local_14 >> 3 & 1U) << 2 | ll << 3);
  }
  o(b);
  return;
}

Assistant:

static void orex(int ll, int r, int r2, int b) {
  if ((r & VT_VALMASK) >= VT_CONST)
    r = 0;
  if ((r2 & VT_VALMASK) >= VT_CONST)
    r2 = 0;
  if (ll || REX_BASE(r) || REX_BASE(r2))
    o(0x40 | REX_BASE(r) | (REX_BASE(r2) << 2) | (ll << 3));
  o(b);
}